

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

CType * cconv_childqual(CTState *cts,CType *ct,CTInfo *qual)

{
  ushort uVar1;
  uint uVar2;
  CType *pCVar3;
  
  pCVar3 = cts->tab;
  while( true ) {
    do {
      uVar1 = (ushort)ct->info;
      ct = pCVar3 + uVar1;
      uVar2 = pCVar3[uVar1].info;
    } while (uVar2 >> 0x1c == 5);
    if (uVar2 >> 0x1c != 8) break;
    if ((uVar2 & 0xff0000) == 0x10000) {
      *qual = *qual | ct->size;
    }
  }
  *qual = *qual | uVar2 & 0x3000000;
  return ct;
}

Assistant:

static CType *cconv_childqual(CTState *cts, CType *ct, CTInfo *qual)
{
  ct = ctype_child(cts, ct);
  for (;;) {
    if (ctype_isattrib(ct->info)) {
      if (ctype_attrib(ct->info) == CTA_QUAL) *qual |= ct->size;
    } else if (!ctype_isenum(ct->info)) {
      break;
    }
    ct = ctype_child(cts, ct);
  }
  *qual |= (ct->info & CTF_QUAL);
  return ct;
}